

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          char *makefile,string *target)

{
  bool bVar1;
  char *path;
  char *path_00;
  char *path_01;
  string makefileName;
  string generator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",(allocator *)&local_50);
  std::operator+(&local_50,make,"\"");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_50);
  bVar1 = std::operator==(&local_50,"NMake Makefiles");
  if (bVar1) {
    cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_90,(cmSystemTools *)makefile,path);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::operator+(&local_b0,&local_90,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+(&local_70,", \"",target);
    std::operator+(&local_b0,&local_70,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    bVar1 = std::operator==(&local_50,"Ninja");
    if (bVar1) {
      cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_90,(cmSystemTools *)makefile,path_00);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&local_b0,&local_90,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator+(&local_70,", \"",target);
      std::operator+(&local_b0,&local_70,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      bVar1 = std::operator==(&local_50,"MinGW Makefiles");
      if (bVar1) {
        std::__cxx11::string::assign((char *)&local_90);
      }
      else {
        cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_b0,(cmSystemTools *)makefile,path_01);
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::operator+(&local_b0,&local_90,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator+(&local_70,", \"",target);
      std::operator+(&local_b0,&local_70,"\"");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const char* makefile, const std::string& target)
{
  std::string command = "\"";
  command += make + "\"";
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += ", \"/NOLOGO\", \"/f\", \"";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += ", \"-f\", \"";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += ", \"-f\", \"";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}